

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_add_item_to_object_or_array_should_not_add_itself(void)

{
  cJSON_bool cVar1;
  cJSON *object_00;
  cJSON *array_00;
  cJSON_bool flag;
  cJSON *array;
  cJSON *object;
  
  object_00 = cJSON_CreateObject();
  array_00 = cJSON_CreateArray();
  cVar1 = cJSON_AddItemToObject(object_00,"key",object_00);
  if (cVar1 != 0) {
    UnityFail("add an object to itself should fail",0x22c);
  }
  cVar1 = cJSON_AddItemToArray(array_00,array_00);
  if (cVar1 != 0) {
    UnityFail("add an array to itself should fail",0x22f);
  }
  cJSON_Delete(object_00);
  cJSON_Delete(array_00);
  return;
}

Assistant:

static void cjson_add_item_to_object_or_array_should_not_add_itself(void)
{
    cJSON *object = cJSON_CreateObject();
    cJSON *array = cJSON_CreateArray();
    cJSON_bool flag = false;

    flag = cJSON_AddItemToObject(object, "key", object);
    TEST_ASSERT_FALSE_MESSAGE(flag, "add an object to itself should fail");

    flag = cJSON_AddItemToArray(array, array);
    TEST_ASSERT_FALSE_MESSAGE(flag, "add an array to itself should fail");

    cJSON_Delete(object);
    cJSON_Delete(array);
}